

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O2

Result __thiscall tonk::gateway::ParsedXML::Parse(ParsedXML *this,char *data,uint bytes)

{
  string *psVar1;
  string *psVar2;
  char cVar3;
  int iVar4;
  ErrorResult *this_00;
  bool bVar5;
  uint in_ECX;
  undefined4 in_register_00000014;
  long lVar6;
  Result *success;
  ulong uVar7;
  ParsedXML *pPVar8;
  string *this_01;
  _Alloc_hider _Var9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  string local_d8;
  ulong local_b8;
  string *local_b0;
  ParsedXML *local_a8;
  string tagData;
  string serviceType;
  string controlURL;
  
  lVar6 = CONCAT44(in_register_00000014,bytes);
  data[8] = '\0';
  data[9] = '\0';
  data[10] = '\0';
  data[0xb] = '\0';
  data[0xc] = '\0';
  data[0xd] = '\0';
  data[0xe] = '\0';
  data[0xf] = '\0';
  uVar7 = 0;
  psVar1 = (string *)(data + 0x20);
  bVar5 = false;
  psVar2 = (string *)(data + 0x40);
  serviceType._M_dataplus._M_p = (pointer)&serviceType.field_2;
  **(undefined1 **)data = 0;
  data[0x28] = '\0';
  data[0x29] = '\0';
  data[0x2a] = '\0';
  data[0x2b] = '\0';
  data[0x2c] = '\0';
  data[0x2d] = '\0';
  data[0x2e] = '\0';
  data[0x2f] = '\0';
  **(undefined1 **)(data + 0x20) = 0;
  data[0x48] = '\0';
  data[0x49] = '\0';
  data[0x4a] = '\0';
  data[0x4b] = '\0';
  data[0x4c] = '\0';
  data[0x4d] = '\0';
  data[0x4e] = '\0';
  data[0x4f] = '\0';
  **(undefined1 **)(data + 0x40) = 0;
  controlURL._M_dataplus._M_p = (pointer)&controlURL.field_2;
  serviceType._M_string_length = 0;
  serviceType.field_2._M_local_buf[0] = '\0';
  controlURL._M_string_length = 0;
  controlURL.field_2._M_local_buf[0] = '\0';
  uVar12 = 0;
  local_a8 = this;
  do {
    pPVar8 = local_a8;
    uVar11 = 0;
LAB_0012eb82:
    do {
      uVar7 = uVar7 + 1;
      if (uVar7 - in_ECX == 1) {
        if (((string *)((long)data + 0x20))->_M_string_length == 0) {
          std::__cxx11::string::string
                    ((string *)&local_d8,"Unable to find ServiceType",(allocator *)&tagData);
          pPVar8 = local_a8;
          this_00 = (ErrorResult *)operator_new(0x38);
          ErrorResult::ErrorResult(this_00,&local_d8);
        }
        else {
          if (((string *)((long)data + 0x40))->_M_string_length != 0) {
            (local_a8->URLBase)._M_dataplus._M_p = (char *)0x0;
            goto LAB_0012ee6e;
          }
          std::__cxx11::string::string
                    ((string *)&local_d8,"Unable to find ControlURL",(allocator *)&tagData);
          this_00 = (ErrorResult *)operator_new(0x38);
          ErrorResult::ErrorResult(this_00,&local_d8);
        }
        (pPVar8->URLBase)._M_dataplus._M_p = (pointer)this_00;
        std::__cxx11::string::~string((string *)&local_d8);
LAB_0012ee6e:
        std::__cxx11::string::~string((string *)&controlURL);
        std::__cxx11::string::~string((string *)&serviceType);
        return (Result)(ErrorResult *)pPVar8;
      }
      cVar3 = *(char *)(lVar6 + -1 + uVar7);
      uVar10 = (uint)uVar11;
      if (uVar10 == 0) {
        uVar11 = 0;
        if (cVar3 == '<') {
          uVar11 = uVar7 & 0xffffffff;
        }
        goto LAB_0012eb82;
      }
    } while (cVar3 != '>');
    local_b0 = (string *)data;
    tagData._M_dataplus._M_p = (pointer)&tagData.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&tagData,uVar11 + lVar6,(ulong)(~uVar10 + (uint)uVar7) + uVar11 + lVar6);
    cVar3 = *tagData._M_dataplus._M_p;
    _Var9._M_p = tagData._M_dataplus._M_p;
    if ((cVar3 == '/') && (_Var9._M_p = tagData._M_dataplus._M_p + 1, uVar12 < uVar10)) {
      local_b8 = (ulong)uVar12;
      uVar12 = ~uVar12;
      if (bVar5) {
        iVar4 = strcasecmp(_Var9._M_p,"serviceType");
        if (iVar4 == 0) {
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d8,local_b8 + lVar6,
                     (ulong)(uVar10 + uVar12) + local_b8 + lVar6);
          this_01 = &serviceType;
        }
        else {
          iVar4 = strcasecmp(_Var9._M_p,"controlURL");
          if (iVar4 != 0) goto LAB_0012ecea;
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d8,local_b8 + lVar6,
                     (ulong)(uVar10 + uVar12) + local_b8 + lVar6);
          this_01 = &controlURL;
        }
      }
      else {
        iVar4 = strcasecmp(_Var9._M_p,"URLBase");
        if (iVar4 != 0) goto LAB_0012ecea;
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,local_b8 + lVar6,(ulong)(uVar10 + uVar12) + local_b8 + lVar6)
        ;
        this_01 = local_b0;
      }
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
LAB_0012ecea:
    iVar4 = strcasecmp(_Var9._M_p,"service");
    if (iVar4 == 0) {
      bVar5 = cVar3 != '/';
    }
    if (cVar3 == '/' && iVar4 == 0) {
      if (2 < serviceType._M_string_length) {
        std::__cxx11::string::substr((ulong)&local_d8,(ulong)&serviceType);
        _Var9._M_p = local_d8._M_dataplus._M_p;
        iVar4 = strcasecmp(local_d8._M_dataplus._M_p,"urn:schemas-upnp-org:service:WANIPConnection")
        ;
        if (iVar4 == 0) {
          std::__cxx11::string::~string((string *)&local_d8);
        }
        else {
          iVar4 = strcasecmp(_Var9._M_p,"urn:schemas-upnp-org:service:WANPPPConnection");
          std::__cxx11::string::~string((string *)&local_d8);
          if (iVar4 != 0) {
            bVar5 = false;
            goto LAB_0012edcb;
          }
        }
        std::__cxx11::string::_M_assign(psVar1);
        std::__cxx11::string::_M_assign(psVar2);
      }
      bVar5 = false;
    }
LAB_0012edcb:
    std::__cxx11::string::~string((string *)&tagData);
    data = (char *)local_b0;
    uVar12 = (uint)uVar7;
  } while( true );
}

Assistant:

Result ParsedXML::Parse(const char* data, unsigned bytes)
{
    URLBase.clear();
    ServiceType.clear();
    ControlURL.clear();

    unsigned tag_start = 0, data_start = 0;
    bool inService = false;
    std::string serviceType, controlURL;

    for (unsigned i = 0; i < bytes; ++i)
    {
        char ch = data[i];
        if (tag_start != 0)
        {
            if (ch == '>')
            {
                std::string tagData(data + tag_start, i - tag_start);
                const char* tag = tagData.c_str();
                bool end = (tag[0] == '/');

                if (end)
                {
                    ++tag;
                    if (tag_start > data_start)
                    {
                        if (inService)
                        {
                            if (0 == StrCaseCompare(tag, "serviceType")) {
                                serviceType = std::string(data + data_start, tag_start - data_start - 1);
                            }
                            else if (0 == StrCaseCompare(tag, "controlURL")) {
                                controlURL = std::string(data + data_start, tag_start - data_start - 1);
                            }
                        }
                        else if (0 == StrCaseCompare(tag, "URLBase")) {
                            URLBase = std::string(data + data_start, tag_start - data_start - 1);
                        }
                    }
                }

                if (0 == StrCaseCompare(tag, "service"))
                {
                    if (end && IsWANConnectionServiceType(serviceType))
                    {
                        ServiceType = serviceType;
                        ControlURL = controlURL;
                    }
                    inService = !end;
                }

                tag_start = 0;
                data_start = i + 1;
            }
        }
        else if (ch == '<') {
            tag_start = i + 1;
        }
    }

    if (ServiceType.empty()) {
        return Result("Unable to find ServiceType");
    }
    if (ControlURL.empty()) {
        return Result("Unable to find ControlURL");
    }
    return Result::Success();
}